

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void resolveAlias(Parse *pParse,ExprList *pEList,int iCol,Expr *pExpr,char *zType,int nSubquery)

{
  byte *pbVar1;
  sqlite3 *db;
  char *__src;
  char cVar2;
  u16 uVar3;
  undefined4 uVar4;
  Expr *pExpr_00;
  u16 *puVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  Expr *pEVar9;
  Expr *pEVar10;
  uint n;
  byte bVar11;
  Walker local_58;
  
  bVar11 = 0;
  pEVar9 = pEList->a[iCol].pExpr;
  db = pParse->db;
  pExpr_00 = exprDup(db,pEVar9,0,(u8 **)0x0);
  if (pExpr_00 != (Expr *)0x0) {
    if ((pEVar9->op != 0x98) && (*zType != 'G')) {
      if (0 < nSubquery) {
        local_58.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
        local_58.pParse = (Parse *)0x0;
        local_58.walkerDepth = 0;
        local_58.bSelectDepthFirst = '\0';
        local_58._29_3_ = 0;
        local_58.xExprCallback = incrAggDepth;
        local_58.u._4_4_ = 0;
        local_58.u.i = nSubquery;
        sqlite3WalkExpr(&local_58,pExpr_00);
      }
      pExpr_00 = sqlite3PExpr(pParse,0x18,pExpr_00,(Expr *)0x0,(Token *)0x0);
      if (pExpr_00 == (Expr *)0x0) {
        return;
      }
      puVar5 = &pEList->a[iCol].iAlias;
      if (*puVar5 == 0) {
        iVar7 = pParse->nAlias + 1;
        pParse->nAlias = iVar7;
        *puVar5 = (u16)iVar7;
      }
      pExpr_00->iTable = (uint)*puVar5;
    }
    if (pExpr->op == '\\') {
      pExpr_00 = sqlite3ExprAddCollateString(pParse,pExpr_00,(pExpr->u).zToken);
    }
    pbVar1 = (byte *)((long)&pExpr->flags + 1);
    *pbVar1 = *pbVar1 | 0x80;
    sqlite3ExprDelete(db,pExpr);
    pEVar9 = pExpr_00;
    pEVar10 = pExpr;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      cVar2 = pEVar9->affinity;
      uVar3 = pEVar9->flags;
      uVar4 = *(undefined4 *)&pEVar9->field_0x4;
      pEVar10->op = pEVar9->op;
      pEVar10->affinity = cVar2;
      pEVar10->flags = uVar3;
      *(undefined4 *)&pEVar10->field_0x4 = uVar4;
      pEVar9 = (Expr *)((long)pEVar9 + (ulong)bVar11 * -0x10 + 8);
      pEVar10 = (Expr *)((long)pEVar10 + (ulong)bVar11 * -0x10 + 8);
    }
    if (((pExpr->flags & 0x400) == 0) && (__src = (pExpr->u).zToken, __src != (char *)0x0)) {
      lVar8 = 0;
      do {
        pcVar6 = __src + lVar8;
        lVar8 = lVar8 + 1;
      } while (*pcVar6 != '\0');
      n = ((int)lVar8 - 1U & 0x3fffffff) + 1;
      pcVar6 = (char *)sqlite3DbMallocRaw(db,n);
      if (pcVar6 != (char *)0x0) {
        memcpy(pcVar6,__src,(ulong)n);
      }
      (pExpr->u).zToken = pcVar6;
      pExpr->flags2 = pExpr->flags2 | 1;
    }
    sqlite3DbFree(db,pExpr_00);
  }
  return;
}

Assistant:

static void resolveAlias(
  Parse *pParse,         /* Parsing context */
  ExprList *pEList,      /* A result set */
  int iCol,              /* A column in the result set.  0..pEList->nExpr-1 */
  Expr *pExpr,           /* Transform this into an alias to the result set */
  const char *zType,     /* "GROUP" or "ORDER" or "" */
  int nSubquery          /* Number of subqueries that the label is moving */
){
  Expr *pOrig;           /* The iCol-th column of the result set */
  Expr *pDup;            /* Copy of pOrig */
  sqlite3 *db;           /* The database connection */

  assert( iCol>=0 && iCol<pEList->nExpr );
  pOrig = pEList->a[iCol].pExpr;
  assert( pOrig!=0 );
  assert( pOrig->flags & EP_Resolved );
  db = pParse->db;
  pDup = sqlite3ExprDup(db, pOrig, 0);
  if( pDup==0 ) return;
  if( pOrig->op!=TK_COLUMN && zType[0]!='G' ){
    incrAggFunctionDepth(pDup, nSubquery);
    pDup = sqlite3PExpr(pParse, TK_AS, pDup, 0, 0);
    if( pDup==0 ) return;
    if( pEList->a[iCol].iAlias==0 ){
      pEList->a[iCol].iAlias = (u16)(++pParse->nAlias);
    }
    pDup->iTable = pEList->a[iCol].iAlias;
  }
  if( pExpr->op==TK_COLLATE ){
    pDup = sqlite3ExprAddCollateString(pParse, pDup, pExpr->u.zToken);
  }

  /* Before calling sqlite3ExprDelete(), set the EP_Static flag. This 
  ** prevents ExprDelete() from deleting the Expr structure itself,
  ** allowing it to be repopulated by the memcpy() on the following line.
  ** The pExpr->u.zToken might point into memory that will be freed by the
  ** sqlite3DbFree(db, pDup) on the last line of this block, so be sure to
  ** make a copy of the token before doing the sqlite3DbFree().
  */
  ExprSetProperty(pExpr, EP_Static);
  sqlite3ExprDelete(db, pExpr);
  memcpy(pExpr, pDup, sizeof(*pExpr));
  if( !ExprHasProperty(pExpr, EP_IntValue) && pExpr->u.zToken!=0 ){
    assert( (pExpr->flags & (EP_Reduced|EP_TokenOnly))==0 );
    pExpr->u.zToken = sqlite3DbStrDup(db, pExpr->u.zToken);
    pExpr->flags2 |= EP2_MallocedToken;
  }
  sqlite3DbFree(db, pDup);
}